

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

Node * DeleteAfter(Node *P)

{
  Node *pNVar1;
  
  pNVar1 = P->next;
  if (pNVar1 != (Node *)0x0) {
    P->next = pNVar1->next;
  }
  return pNVar1;
}

Assistant:

Node *DeleteAfter(Node *P) {  //删除P后面的一个单链表结点
    Node *ptr = P->next;  //保存当前结点的后继结点
    if(ptr == NULL)
        return NULL;
    P->next = ptr->next;  //当前结点指向原来结点的后继
    return ptr;    //返回指向被删除结点的指针

}